

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

void charactersTokenizer(void *ctx,xmlChar *ch,int len)

{
  long lVar1;
  
  lVar1 = *(long *)((long)ctx + 0x1a8);
  if (*(int *)(lVar1 + 4) == 0) {
    fwrite("Character\n",10,1,(FILE *)SAXdebug);
    *(undefined4 *)(lVar1 + 4) = 1;
  }
  fwrite(ch,1,(long)len,(FILE *)SAXdebug);
  return;
}

Assistant:

static void
charactersTokenizer(void *ctx, const xmlChar *ch, int len) {
    xmlParserCtxtPtr ctxt = ctx;
    xmlTokenizerConfig *config = ctxt->_private;

    if (!config->inCharacters) {
        fprintf(SAXdebug, "Character\n");
        config->inCharacters = 1;
    }

    fwrite(ch, 1, len, SAXdebug);
}